

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitStringEq(PrintExpressionContents *this,StringEq *curr)

{
  long lVar1;
  ostream *stream;
  char *pcVar2;
  
  if (curr->op == StringEqCompare) {
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar2 = "string.compare";
    lVar1 = 0xe;
  }
  else {
    if (curr->op != StringEqEqual) {
      handle_unreachable("invalid string.eq*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                         ,0x9ea);
    }
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar2 = "string.eq";
    lVar1 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar2,lVar1);
  Colors::outputColorCode(stream,"\x1b[0m");
  return;
}

Assistant:

void visitStringEq(StringEq* curr) {
    switch (curr->op) {
      case StringEqEqual:
        printMedium(o, "string.eq");
        break;
      case StringEqCompare:
        printMedium(o, "string.compare");
        break;
      default:
        WASM_UNREACHABLE("invalid string.eq*");
    }
  }